

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void Reprint(lemon *lemp)

{
  undefined8 *puVar1;
  size_t sVar2;
  int local_34;
  int skip;
  int ncolumns;
  int len;
  int maxlen;
  int j;
  int i;
  symbol *sp;
  rule *rp;
  lemon *lemp_local;
  
  printf("// Reprint of input file \"%s\".\n// Symbols:\n",lemp->filename);
  ncolumns = 10;
  for (maxlen = 0; maxlen < lemp->nsymbol; maxlen = maxlen + 1) {
    sVar2 = strlen(lemp->symbols[maxlen]->name);
    if (ncolumns < (int)sVar2) {
      ncolumns = (int)sVar2;
    }
  }
  local_34 = (int)(0x4c / (long)(ncolumns + 5));
  if (local_34 < 1) {
    local_34 = 1;
  }
  local_34 = (lemp->nsymbol + local_34 + -1) / local_34;
  maxlen = 0;
  do {
    if (local_34 <= maxlen) {
      for (sp = (symbol *)lemp->rule; sp != (symbol *)0x0; sp = sp[1].fallback) {
        printf("%s",*(undefined8 *)sp->name);
        printf(" ::=");
        for (maxlen = 0; maxlen < *(int *)&sp->fallback; maxlen = maxlen + 1) {
          puVar1 = *(undefined8 **)(*(long *)&sp->prec + (long)maxlen * 8);
          if (*(int *)((long)puVar1 + 0xc) == 2) {
            printf(" %s",**(undefined8 **)puVar1[0xb]);
            for (len = 1; len < *(int *)((long)puVar1 + 0x54); len = len + 1) {
              printf("|%s",**(undefined8 **)(puVar1[0xb] + (long)len * 8));
            }
          }
          else {
            printf(" %s",*puVar1);
          }
        }
        printf(".");
        if (sp->subsym != (symbol **)0x0) {
          printf(" [%s]",*sp->subsym);
        }
        printf("\n");
      }
      return;
    }
    printf("//");
    for (len = maxlen; len < lemp->nsymbol; len = local_34 + len) {
      if (lemp->symbols[len]->index != len) {
        __assert_fail("sp->index==j",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                      ,0xbc8,"void Reprint(struct lemon *)");
      }
      printf(" %3d %-*.*s",(ulong)(uint)len,(ulong)(uint)ncolumns,(ulong)(uint)ncolumns,
             lemp->symbols[len]->name);
    }
    printf("\n");
    maxlen = maxlen + 1;
  } while( true );
}

Assistant:

void Reprint(struct lemon *lemp)
{
  struct rule *rp;
  struct symbol *sp;
  int i, j, maxlen, len, ncolumns, skip;
  printf("// Reprint of input file \"%s\".\n// Symbols:\n",lemp->filename);
  maxlen = 10;
  for(i=0; i<lemp->nsymbol; i++){
    sp = lemp->symbols[i];
    len = lemonStrlen(sp->name);
    if( len>maxlen ) maxlen = len;
  }
  ncolumns = 76/(maxlen+5);
  if( ncolumns<1 ) ncolumns = 1;
  skip = (lemp->nsymbol + ncolumns - 1)/ncolumns;
  for(i=0; i<skip; i++){
    printf("//");
    for(j=i; j<lemp->nsymbol; j+=skip){
      sp = lemp->symbols[j];
      assert( sp->index==j );
      printf(" %3d %-*.*s",j,maxlen,maxlen,sp->name);
    }
    printf("\n");
  }
  for(rp=lemp->rule; rp; rp=rp->next){
    printf("%s",rp->lhs->name);
    /*    if( rp->lhsalias ) printf("(%s)",rp->lhsalias); */
    printf(" ::=");
    for(i=0; i<rp->nrhs; i++){
      sp = rp->rhs[i];
      if( sp->type==MULTITERMINAL ){
        printf(" %s", sp->subsym[0]->name);
        for(j=1; j<sp->nsubsym; j++){
          printf("|%s", sp->subsym[j]->name);
        }
      }else{
        printf(" %s", sp->name);
      }
      /* if( rp->rhsalias[i] ) printf("(%s)",rp->rhsalias[i]); */
    }
    printf(".");
    if( rp->precsym ) printf(" [%s]",rp->precsym->name);
    /* if( rp->code ) printf("\n    %s",rp->code); */
    printf("\n");
  }
}